

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O0

uint zvgDmaPutMem(uchar *mem,uint len)

{
  uint local_1c;
  uint len_local;
  uchar *mem_local;
  
  if (ZvgIO.dmaCurCount < 0x8000) {
    local_1c = len;
    if (0x8000 < ZvgIO.dmaCurCount + len) {
      local_1c = 0x8000 - ZvgIO.dmaCurCount;
    }
    memcpy(ZvgIO.dmaCurP + ZvgIO.dmaCurCount,mem,(ulong)local_1c);
    ZvgIO.dmaCurCount = local_1c + ZvgIO.dmaCurCount;
    mem_local._4_4_ = 0;
  }
  else {
    mem_local._4_4_ = 0x10;
  }
  return mem_local._4_4_;
}

Assistant:

uint zvgDmaPutMem( uchar *mem, uint len)
{
	if (ZvgIO.dmaCurCount < MEM_BFR_SZ)
	{
		if ((ZvgIO.dmaCurCount + len) > MEM_BFR_SZ)
			len = MEM_BFR_SZ - ZvgIO.dmaCurCount;

		memcpy( &ZvgIO.dmaCurP[ZvgIO.dmaCurCount], mem, len);
		ZvgIO.dmaCurCount += len;
	}
	else
		return (errBfrFull);

	return (errOk);
}